

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

void duckdb::TimezoneHourFun::GetFunctions(void)

{
  duckdb *in_RDI;
  code *local_68 [2];
  code *local_58;
  code *local_50;
  code *local_48 [2];
  code *local_38;
  code *local_30;
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::TimezoneHourOperator>;
  local_10 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  local_48[1] = (code *)0x0;
  local_48[0] = DatePart::
                UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::TimezoneHourOperator>;
  local_30 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  local_68[1] = (code *)0x0;
  local_68[0] = ScalarFunction::
                UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::TimezoneHourOperator>;
  local_50 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  GetGenericDatePartFunction<(duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>(*)(duckdb::ExpressionState&,duckdb::BoundFunctionExpression_const&,duckdb::FunctionData*))0>
            (in_RDI,(scalar_function_t *)local_28,(scalar_function_t *)local_48,
             (scalar_function_t *)local_68,
             DatePart::TimezoneHourOperator::PropagateStatistics<duckdb::date_t>,
             DatePart::TimezoneHourOperator::PropagateStatistics<duckdb::timestamp_t>);
  std::_Function_base::~_Function_base((_Function_base *)local_68);
  std::_Function_base::~_Function_base((_Function_base *)local_48);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return;
}

Assistant:

ScalarFunctionSet TimezoneHourFun::GetFunctions() {
	return GetDatePartFunction<DatePart::TimezoneHourOperator>();
}